

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

value_t __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
::compute_diameter(Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
                   *this,simplex_t index,dimension_t dim)

{
  int iVar1;
  pointer ppfVar2;
  pointer piVar3;
  int iVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
  local_30 [8];
  pointer local_28;
  
  iVar4 = (int)CONCAT71(in_register_00000011,dim);
  std::vector<int,_std::allocator<int>_>::resize(&this->vertices,(long)iVar4 + 1);
  local_28 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
  ::
  get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (local_30,(simplex_t)this,(dimension_t)index,iVar4,
             (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)((ulong)((long)(this->dist).rows.
                               super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->dist).rows.
                              super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3));
  if (dim < '\0') {
    fVar9 = -INFINITY;
  }
  else {
    ppfVar2 = (this->dist).rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar5 = 1;
    if ('\x01' < (char)(iVar4 + 1U)) {
      uVar5 = iVar4 + 1U & 0xff;
    }
    piVar3 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar9 = -INFINITY;
    uVar6 = 0;
    do {
      if (uVar6 != 0) {
        iVar4 = piVar3[uVar6];
        uVar7 = 0;
        fVar10 = fVar9;
        do {
          iVar1 = piVar3[uVar7];
          fVar9 = 0.0;
          if (iVar4 != iVar1) {
            if (iVar4 < iVar1) {
              pfVar8 = ppfVar2[iVar1] + iVar4;
            }
            else {
              pfVar8 = ppfVar2[iVar4] + iVar1;
            }
            fVar9 = *pfVar8;
          }
          if (fVar9 <= fVar10) {
            fVar9 = fVar10;
          }
          uVar7 = uVar7 + 1;
          fVar10 = fVar9;
        } while (uVar6 != uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  return fVar9;
}

Assistant:

value_t compute_diameter(const simplex_t index, const dimension_t dim) const {
    value_t diam = -std::numeric_limits<value_t>::infinity();

    vertices.resize(dim + 1);
    get_simplex_vertices(index, dim, dist.size(), vertices.rbegin());

    for (dimension_t i = 0; i <= dim; ++i)
      for (dimension_t j = 0; j < i; ++j) {
        diam = std::max(diam, dist(vertices[i], vertices[j]));
      }
    return diam;
  }